

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O1

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildConstraintMatrix
          (BoundingBoxProjectionConstraint *this)

{
  Polygon2D *this_00;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  size_t sVar6;
  Vector2 *pVVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  size_t sVar12;
  
  this_00 = &this->projectedBoundingBox;
  sVar6 = Polygon2D::getNrOfVertices(this_00);
  iDynTree::MatrixDynSize::resize((ulong)&this->A,sVar6);
  Polygon2D::getNrOfVertices(this_00);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  sVar6 = Polygon2D::getNrOfVertices(this_00);
  if (sVar6 != 0) {
    sVar6 = 0;
    do {
      pVVar7 = Polygon2D::operator()(this_00,sVar6);
      dVar2 = pVVar7->m_data[0];
      dVar3 = pVVar7->m_data[1];
      sVar8 = Polygon2D::getNrOfVertices(this_00);
      uVar1 = sVar6 + 1;
      sVar12 = 0;
      if (sVar6 != sVar8 - 1) {
        sVar12 = uVar1;
      }
      pVVar7 = Polygon2D::operator()(this_00,sVar12);
      dVar4 = pVVar7->m_data[0];
      dVar5 = pVVar7->m_data[1];
      lVar9 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar10 = iDynTree::MatrixDynSize::cols();
      pdVar11 = (double *)(lVar9 + lVar10 * sVar6 * 8);
      *pdVar11 = dVar5 - dVar3;
      pdVar11[1] = dVar2 - dVar4;
      pdVar11 = (double *)iDynTree::VectorDynSize::operator()(&this->b,sVar6);
      *pdVar11 = dVar2 * dVar5 - dVar3 * dVar4;
      sVar12 = Polygon2D::getNrOfVertices(this_00);
      sVar6 = uVar1;
    } while (uVar1 < sVar12);
  }
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedBoundingBox.getNrOfVertices(),2);
        b.resize(projectedBoundingBox.getNrOfVertices());

        // We assume that the vertices in projectedBoundingBox are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedBoundingBox.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedBoundingBox(i);
            Vector2 p1;

            if ( i != projectedBoundingBox.getNrOfVertices()-1 )
            {
                p1 = projectedBoundingBox(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedBoundingBox(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }